

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chess.cpp
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
banksia::ChessBoard::commentEcoString_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,ChessBoard *this)

{
  pointer pbVar1;
  pointer pHVar2;
  bool bVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  long *plVar6;
  pointer *ppbVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  _Base_ptr p_Var11;
  _Base_ptr p_Var12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> ecoString;
  undefined1 local_78 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  pointer local_48;
  long lStack_40;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pHVar2 = (this->super_BoardCore).histList.
           super__Vector_base<banksia::Hist,_std::allocator<banksia::Hist>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar8 = (int)((ulong)((long)(this->super_BoardCore).histList.
                              super__Vector_base<banksia::Hist,_std::allocator<banksia::Hist>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)pHVar2) >> 4) *
          0x38e38e39 - 1;
  if (-1 < (int)uVar8) {
    uVar9 = (ulong)uVar8;
    do {
      if (ecoMap_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0
         ) {
        uVar10 = pHVar2[uVar9].hashKey;
        p_Var11 = &ecoMap_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header;
        p_Var12 = ecoMap_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        do {
          if (*(ulong *)(p_Var12 + 1) >= uVar10) {
            p_Var11 = p_Var12;
          }
          p_Var12 = (&p_Var12->_M_left)[*(ulong *)(p_Var12 + 1) < uVar10];
        } while (p_Var12 != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)p_Var11 != &ecoMap_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) &&
           (*(ulong *)(p_Var11 + 1) <= uVar10)) {
          splitString((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_78,(string *)&p_Var11[1]._M_parent,';');
          uVar5 = local_78._8_8_;
          uVar4 = local_78._0_8_;
          local_48 = (__return_storage_ptr__->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_end_of_storage;
          (__return_storage_ptr__->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_78._16_8_;
          local_58._M_allocated_capacity =
               (size_type)
               (__return_storage_ptr__->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
          local_58._8_8_ =
               (__return_storage_ptr__->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
          (__return_storage_ptr__->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start = (pointer)local_78._0_8_;
          (__return_storage_ptr__->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish = (pointer)local_78._8_8_;
          local_78._0_8_ = (pointer)0x0;
          local_78._8_8_ = (pointer)0x0;
          local_78._16_8_ = (pointer)0x0;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_58);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_78);
          uVar10 = uVar5 - uVar4;
          if (uVar10 < 0x21) {
            return __return_storage_ptr__;
          }
          pbVar1 = (pointer)(local_78 + 0x10);
          local_78._0_8_ = pbVar1;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_78,*(long *)uVar4,*(size_type *)(uVar4 + 8) + *(long *)uVar4);
          std::__cxx11::string::append(local_78);
          if (1 < (ulong)((long)uVar10 >> 5)) {
            plVar6 = (long *)std::__cxx11::string::_M_append
                                       (local_78,(ulong)(((pointer)(uVar4 + 0x20))->_M_dataplus).
                                                        _M_p);
            ppbVar7 = (pointer *)(plVar6 + 2);
            if ((pointer *)*plVar6 == ppbVar7) {
              local_48 = *ppbVar7;
              lStack_40 = plVar6[3];
              local_58._M_allocated_capacity = (size_type)&local_48;
            }
            else {
              local_48 = *ppbVar7;
              local_58._M_allocated_capacity = (size_type)(pointer *)*plVar6;
            }
            local_58._8_8_ = plVar6[1];
            *plVar6 = (long)ppbVar7;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            if ((pointer)local_78._0_8_ != pbVar1) {
              operator_delete((void *)local_78._0_8_);
            }
            if (0x40 < uVar10) {
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_78,", ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (uVar4 + 0x40));
              std::__cxx11::string::_M_append(local_58._M_local_buf,local_78._0_8_);
              if ((pointer)local_78._0_8_ != pbVar1) {
                operator_delete((void *)local_78._0_8_);
              }
            }
            std::__cxx11::string::_M_append
                      ((char *)&pHVar2[uVar9].comment,local_58._M_allocated_capacity);
            if ((pointer *)local_58._M_allocated_capacity == &local_48) {
              return __return_storage_ptr__;
            }
            operator_delete((void *)local_58._M_allocated_capacity);
            return __return_storage_ptr__;
          }
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",1);
        }
      }
      bVar3 = 0 < (long)uVar9;
      uVar9 = uVar9 - 1;
    } while (bVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> ChessBoard::commentEcoString()
{
    std::vector<std::string> vec;
    for(int i = int(histList.size() - 1); i >= 0; i--) {
        auto& hist = histList[i];
        auto it = ecoMap.find(hist.hashKey);
        if (it != ecoMap.end()) {
            vec = splitString(it->second, ';');
            if (vec.size() > 1) {
                auto ecoString = vec.front() + ": " + vec.at(1);
                if (vec.size() > 2) {
                    ecoString += ", " + vec.at(2);
                }
                hist.comment += ecoString;
            }
            return vec;
        }
    }
    return vec;
}